

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter.cpp
# Opt level: O2

bool __thiscall BamTools::FilterTool::FilterToolPrivate::SetupFilters(FilterToolPrivate *this)

{
  bool bVar1;
  
  InitProperties(this);
  if (this->m_settings->HasScript == true) {
    bVar1 = ParseScript(this);
    return bVar1;
  }
  bVar1 = ParseCommandLine(this);
  return bVar1;
}

Assistant:

bool FilterTool::FilterToolPrivate::SetupFilters()
{

    // set up filter engine with supported properties
    InitProperties();

    // parse script for filter rules, if given
    if (m_settings->HasScript) return ParseScript();

    // otherwise check command line for filters
    else
        return ParseCommandLine();
}